

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

int buf_read(char *pathname,char **buf,int *len)

{
  int iVar1;
  char *__buf;
  ssize_t sVar2;
  stat sb;
  stat sStack_b8;
  
  *buf = (char *)0x0;
  *len = 0;
  iVar1 = open(pathname,0);
  if (iVar1 < 1) {
    iVar1 = -1;
  }
  else {
    memset(&sStack_b8,0,0x90);
    fstat(iVar1,&sStack_b8);
    *len = (int)sStack_b8.st_size;
    __buf = (char *)malloc((long)((int)sStack_b8.st_size + 2));
    *buf = __buf;
    sVar2 = read(iVar1,__buf,(long)(int)sStack_b8.st_size);
    (*buf)[sVar2] = '\0';
    (*buf)[sVar2 + 1] = '\0';
    *len = (int)sVar2;
    close(iVar1);
    iVar1 = *len;
  }
  return iVar1;
}

Assistant:

int buf_read(const char *pathname, char **buf, int *len) {
  struct stat sb;
  int fd;
  size_t real_size;

  *buf = 0;
  *len = 0;
  fd = open(pathname, O_RDONLY);
  if (fd <= 0) return -1;
  memset(&sb, 0, sizeof(sb));
  fstat(fd, &sb);
  *len = sb.st_size;
  *buf = (char *)MALLOC(*len + 2);
  /* MINGW likes to convert cr lf => lf which messes with the size */
  real_size = read(fd, *buf, *len);
  (*buf)[real_size] = 0;
  (*buf)[real_size + 1] = 0;
  *len = real_size;
  close(fd);
  return *len;
}